

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O0

int __thiscall PP_Expression::shift_expression(PP_Expression *this)

{
  Token TVar1;
  int iVar2;
  Parser *in_RDI;
  int value;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  undefined4 local_4;
  
  local_4 = additive_expression((PP_Expression *)
                                CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  TVar1 = Parser::next((Parser *)CONCAT44(local_4,in_stack_ffffffffffffffe8));
  if (TVar1 == LTLT) {
    iVar2 = shift_expression((PP_Expression *)CONCAT44(local_4,0x4f));
    local_4 = local_4 << ((byte)iVar2 & 0x1f);
  }
  else if (TVar1 == GTGT) {
    iVar2 = shift_expression((PP_Expression *)CONCAT44(local_4,0x50));
    local_4 = local_4 >> ((byte)iVar2 & 0x1f);
  }
  else {
    Parser::prev(in_RDI);
  }
  return local_4;
}

Assistant:

int PP_Expression::shift_expression()
{
    int value = additive_expression();
    switch (next()) {
    case PP_LTLT:
        return value << shift_expression();
    case PP_GTGT:
        return value >> shift_expression();
    default:
        prev();
        return value;
    }
}